

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O1

string * BamTools::Internal::BamToolsIndex::Extension_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)in_RDI,BTI_EXTENSION_abi_cxx11_._M_dataplus._M_p,
             BTI_EXTENSION_abi_cxx11_._M_dataplus._M_p + BTI_EXTENSION_abi_cxx11_._M_string_length);
  return in_RDI;
}

Assistant:

const std::string BamToolsIndex::Extension()
{
    return BamToolsIndex::BTI_EXTENSION;
}